

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-matrix.c
# Opt level: O3

_Bool plutovg_matrix_parse(plutovg_matrix_t *matrix,char *data,int length)

{
  long lVar1;
  int iVar2;
  size_t sVar3;
  char *it;
  byte *pbVar4;
  byte *pbVar5;
  byte *end;
  byte bVar6;
  _Bool _Var7;
  long lVar8;
  long lVar9;
  char *pcVar10;
  bool bVar11;
  float fVar12;
  float values [6];
  plutovg_matrix_t local_98;
  byte *local_78;
  float local_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  undefined8 local_58;
  float local_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  
  matrix->a = 1.0;
  matrix->b = 0.0;
  matrix->c = 0.0;
  matrix->d = 1.0;
  matrix->e = 0.0;
  matrix->f = 0.0;
  if (length == -1) {
    sVar3 = strlen(data);
    length = (int)sVar3;
  }
  local_78 = (byte *)data;
  lVar8 = (long)length;
  if (length < 1) {
LAB_00127db7:
    end = (byte *)(data + length);
    _Var7 = true;
    if (local_78 < end) {
      do {
        lVar8 = (long)end - (long)local_78;
        pbVar4 = local_78 + 6;
        lVar9 = 0;
        do {
          pbVar5 = pbVar4;
          if (lVar9 == 6) goto LAB_0012802d;
          if (local_78[lVar9] != "matrix"[lVar9]) goto LAB_00127e24;
          lVar1 = lVar9 + 1;
          lVar9 = lVar9 + 1;
        } while (local_78 + lVar1 != end);
        pbVar5 = end;
        if ("matrix"[lVar8] == '\0') {
LAB_0012802d:
          local_78 = pbVar5;
          iVar2 = parse_matrix_parameters((char **)&local_78,(char *)end,&local_68,6,0);
          if (iVar2 == 0) {
            return false;
          }
          local_98.a = local_68;
          local_98.b = fStack_64;
          local_98.c = fStack_60;
          local_98.d = fStack_5c;
          local_98.e = (float)local_58;
          local_98.f = (float)((ulong)local_58 >> 0x20);
        }
        else {
LAB_00127e24:
          pcVar10 = "translate";
          pbVar5 = local_78;
          if (local_78 < end) {
            pcVar10 = "translate" + lVar8;
            lVar9 = 0;
            do {
              pbVar5 = local_78 + 9;
              if (lVar9 == 9) goto LAB_00127f8b;
              if (local_78[lVar9] != "translate"[lVar9]) goto LAB_00127e69;
              lVar1 = lVar9 + 1;
              lVar9 = lVar9 + 1;
              pbVar5 = end;
            } while (local_78 + lVar1 != end);
          }
          if (*pcVar10 == '\0') {
LAB_00127f8b:
            local_78 = pbVar5;
            iVar2 = parse_matrix_parameters((char **)&local_78,(char *)end,&local_68,1,1);
            if (iVar2 == 1) {
              local_98.c = 0.0;
              local_98.e = local_68;
LAB_00128190:
              local_98.d = 1.0;
              local_98.b = 0.0;
              local_98.a = 1.0;
              local_98.f = 0.0;
            }
            else {
              if (iVar2 == 0) {
                return false;
              }
              local_98.a = 1.0;
              local_98.b = 0.0;
              local_98.c = 0.0;
              local_98.d = 1.0;
              local_98.e = local_68;
              local_98.f = fStack_64;
            }
          }
          else {
LAB_00127e69:
            pcVar10 = "scale";
            pbVar5 = local_78;
            if (local_78 < end) {
              pcVar10 = "scale" + lVar8;
              lVar9 = 0;
              do {
                pbVar5 = local_78 + 5;
                if (lVar9 == 5) goto LAB_00127fd4;
                if (local_78[lVar9] != "scale"[lVar9]) goto LAB_00127eae;
                lVar1 = lVar9 + 1;
                lVar9 = lVar9 + 1;
                pbVar5 = end;
              } while (local_78 + lVar1 != end);
            }
            if (*pcVar10 == '\0') {
LAB_00127fd4:
              local_78 = pbVar5;
              iVar2 = parse_matrix_parameters((char **)&local_78,(char *)end,&local_68,1,1);
              if (iVar2 == 1) {
                local_98.d = local_68;
              }
              else {
                if (iVar2 == 0) {
                  return false;
                }
                local_98.d = fStack_64;
              }
              local_98.c = 0.0;
              local_98.b = 0.0;
              local_98.a = local_68;
              local_98.e = 0.0;
              local_98.f = 0.0;
            }
            else {
LAB_00127eae:
              pcVar10 = "rotate";
              pbVar5 = local_78;
              if (local_78 < end) {
                pcVar10 = "rotate" + lVar8;
                lVar9 = 0;
                do {
                  if (lVar9 == 6) goto LAB_0012808c;
                  if (local_78[lVar9] != "rotate"[lVar9]) goto LAB_00127eff;
                  lVar1 = lVar9 + 1;
                  lVar9 = lVar9 + 1;
                  pbVar5 = end;
                } while (local_78 + lVar1 != end);
              }
              pbVar4 = pbVar5;
              if (*pcVar10 == '\0') {
LAB_0012808c:
                local_78 = pbVar4;
                iVar2 = parse_matrix_parameters((char **)&local_78,(char *)end,&local_68,1,2);
                if (iVar2 == 3) {
                  local_98.a = 1.0;
                  local_98.b = 0.0;
                  local_98.c = 0.0;
                  local_98.d = 1.0;
                  local_48 = CONCAT44(fStack_60,fStack_64);
                  uStack_40 = 0;
                  plutovg_matrix_multiply(matrix,&local_98,matrix);
                  local_4c = local_68 * 0.017453292;
                  local_6c = cosf(local_4c);
                  local_98.b = sinf(local_4c);
                  local_98.a = local_6c;
                  local_98.c = -local_98.b;
                  local_98.d = local_6c;
                  local_98.e = 0.0;
                  local_98.f = 0.0;
                  plutovg_matrix_multiply(matrix,&local_98,matrix);
                  local_98.a = 1.0;
                  local_98.b = 0.0;
                  local_98.c = 0.0;
                  local_98.d = 1.0;
                  local_98.e = -(float)local_48;
                  local_98.f = -local_48._4_4_;
                }
                else {
                  if (iVar2 == 0) {
                    return false;
                  }
                  local_6c = local_68 * 0.017453292;
                  fVar12 = cosf(local_6c);
                  local_48 = CONCAT44(local_48._4_4_,fVar12);
                  local_98.b = sinf(local_6c);
                  local_98.a = (float)local_48;
                  local_98.c = -local_98.b;
                  local_98.d = (float)local_48;
                  local_98.e = 0.0;
                  local_98.f = 0.0;
                }
              }
              else {
LAB_00127eff:
                pcVar10 = "skewX";
                pbVar4 = local_78;
                if (local_78 < end) {
                  pcVar10 = "skewX" + lVar8;
                  lVar9 = 0;
                  do {
                    pbVar4 = local_78 + 5;
                    if (lVar9 == 5) goto LAB_0012813d;
                    if (local_78[lVar9] != "skewX"[lVar9]) goto LAB_00127f43;
                    lVar1 = lVar9 + 1;
                    lVar9 = lVar9 + 1;
                    pbVar4 = end;
                  } while (local_78 + lVar1 != end);
                }
                if (*pcVar10 == '\0') {
LAB_0012813d:
                  local_78 = pbVar4;
                  iVar2 = parse_matrix_parameters((char **)&local_78,(char *)end,&local_68,1,0);
                  if (iVar2 == 0) {
                    return false;
                  }
                  local_98.c = tanf(local_68 * 0.017453292);
                  local_98.e = 0.0;
                  goto LAB_00128190;
                }
LAB_00127f43:
                if (local_78 < end) {
                  pcVar10 = "skewY" + lVar8;
                  lVar8 = 0;
                  do {
                    pbVar4 = local_78 + 5;
                    if (lVar8 == 5) goto LAB_00128269;
                    if (local_78[lVar8] != "skewY"[lVar8]) {
                      return false;
                    }
                    lVar9 = lVar8 + 1;
                    lVar8 = lVar8 + 1;
                    pbVar4 = end;
                  } while (local_78 + lVar9 != end);
                }
                else {
                  pcVar10 = "skewY";
                  pbVar4 = local_78;
                }
                if (*pcVar10 != '\0') {
                  return false;
                }
LAB_00128269:
                local_78 = pbVar4;
                iVar2 = parse_matrix_parameters((char **)&local_78,(char *)end,&local_68,1,0);
                if (iVar2 == 0) {
                  return false;
                }
                local_98.b = tanf(local_68 * 0.017453292);
                local_98.a = 1.0;
                local_98.c = 0.0;
                local_98.d = 1.0;
                local_98.e = 0.0;
                local_98.f = 0.0;
              }
            }
          }
        }
        plutovg_matrix_multiply(matrix,&local_98,matrix);
        if (local_78 < end) {
          bVar11 = true;
          pbVar4 = local_78;
          do {
            pbVar5 = pbVar4;
            if ((0x20 < (ulong)*pbVar4) || ((0x100002600U >> ((ulong)*pbVar4 & 0x3f) & 1) == 0))
            break;
            pbVar4 = pbVar4 + 1;
            bVar11 = pbVar4 < end;
            pbVar5 = end;
          } while (pbVar4 != end);
          bVar6 = 0;
          if ((bVar11) && (pbVar5 < end)) {
            if (*pbVar5 == 0x2c) {
              pbVar4 = pbVar5 + 1;
              bVar6 = 1;
              pbVar5 = pbVar4;
              if (pbVar4 < end) {
                do {
                  pbVar5 = pbVar4;
                  if ((0x20 < (ulong)*pbVar4) ||
                     ((0x100002600U >> ((ulong)*pbVar4 & 0x3f) & 1) == 0)) break;
                  pbVar4 = pbVar4 + 1;
                  pbVar5 = end;
                } while (pbVar4 != end);
              }
            }
            else {
              bVar6 = 0;
            }
          }
          if (pbVar5 != local_78) {
            local_78 = pbVar5;
          }
        }
        else {
          bVar6 = 0;
        }
      } while (local_78 < end);
      _Var7 = (_Bool)(bVar6 ^ 1);
    }
  }
  else {
    do {
      if ((0x20 < (ulong)*local_78) || ((0x100002600U >> ((ulong)*local_78 & 0x3f) & 1) == 0))
      goto LAB_00127db7;
      lVar8 = lVar8 + -1;
      local_78 = local_78 + 1;
    } while (lVar8 != 0);
    _Var7 = true;
  }
  return _Var7;
}

Assistant:

bool plutovg_matrix_parse(plutovg_matrix_t* matrix, const char* data, int length)
{
    float values[6];
    plutovg_matrix_init_identity(matrix);
    if(length == -1)
        length = strlen(data);
    const char* it = data;
    const char* end = it + length;
    bool has_trailing_comma = false;
    plutovg_skip_ws(&it, end);
    while(it < end) {
        if(plutovg_skip_string(&it, end, "matrix")) {
            int count = parse_matrix_parameters(&it, end, values, 6, 0);
            if(count == 0)
                return false;
            plutovg_matrix_t m = { values[0], values[1], values[2], values[3], values[4], values[5] };
            plutovg_matrix_multiply(matrix, &m, matrix);
        } else if(plutovg_skip_string(&it, end, "translate")) {
            int count = parse_matrix_parameters(&it, end, values, 1, 1);
            if(count == 0)
                return false;
            if(count == 1) {
                plutovg_matrix_translate(matrix, values[0], 0);
            } else {
                plutovg_matrix_translate(matrix, values[0], values[1]);
            }
        } else if(plutovg_skip_string(&it, end, "scale")) {
            int count = parse_matrix_parameters(&it, end, values, 1, 1);
            if(count == 0)
                return false;
            if(count == 1) {
                plutovg_matrix_scale(matrix, values[0], values[0]);
            } else {
                plutovg_matrix_scale(matrix, values[0], values[1]);
            }
        } else if(plutovg_skip_string(&it, end, "rotate")) {
            int count = parse_matrix_parameters(&it, end, values, 1, 2);
            if(count == 0)
                return false;
            if(count == 3)
                plutovg_matrix_translate(matrix, values[1], values[2]);
            plutovg_matrix_rotate(matrix, PLUTOVG_DEG2RAD(values[0]));
            if(count == 3) {
                plutovg_matrix_translate(matrix, -values[1], -values[2]);
            }
        } else if(plutovg_skip_string(&it, end, "skewX")) {
            int count = parse_matrix_parameters(&it, end, values, 1, 0);
            if(count == 0)
                return false;
            plutovg_matrix_shear(matrix, PLUTOVG_DEG2RAD(values[0]), 0);
        } else if(plutovg_skip_string(&it, end, "skewY")) {
            int count = parse_matrix_parameters(&it, end, values, 1, 0);
            if(count == 0)
                return false;
            plutovg_matrix_shear(matrix, 0, PLUTOVG_DEG2RAD(values[0]));
        } else {
            return false;
        }

        plutovg_skip_ws_or_comma(&it, end, &has_trailing_comma);
    }

    return !has_trailing_comma;
}